

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O3

void __thiscall
deqp::QuadGrid::QuadGrid
          (QuadGrid *this,int gridSize,int width,int height,Vec4 *constCoords,
          vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
          *userAttribTransforms,
          vector<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_> *textures)

{
  uint uVar1;
  pointer pVVar2;
  pointer puVar3;
  int iVar4;
  unsigned_short uVar5;
  int i;
  long lVar6;
  unsigned_short uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  pointer pMVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  float fVar19;
  float fy;
  float fVar20;
  float fVar21;
  float fx;
  float fVar22;
  Vector<float,_4> res;
  float local_58 [4];
  undefined8 local_48;
  undefined8 uStack_40;
  
  this->m_gridSize = gridSize;
  uVar1 = gridSize + 1;
  this->m_numVertices = uVar1 * uVar1;
  this->m_numTriangles = gridSize * gridSize * 2;
  lVar6 = 0;
  do {
    (this->m_constCoords).m_data[lVar6] = constCoords->m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::vector
            (&this->m_userAttribTransforms,userAttribTransforms);
  std::vector<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_>::vector
            (&this->m_textures,textures);
  memset(&this->m_screenPos,0,0xf0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this->m_positions,(long)this->m_numVertices);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this->m_coords,(long)this->m_numVertices);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this->m_unitCoords,(long)this->m_numVertices);
  std::vector<float,_std::allocator<float>_>::resize(&this->m_attribOne,(long)this->m_numVertices);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this->m_screenPos,(long)this->m_numVertices);
  lVar6 = 0;
  do {
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               ((long)&this->m_userAttribs[0].
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar6),(long)this->m_numVertices)
    ;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x60);
  if ((uint)gridSize < 0x7fffffff) {
    iVar8 = 0;
    do {
      fVar19 = (float)iVar8 / (float)gridSize;
      fVar20 = fVar19 + fVar19 + -1.0;
      uVar9 = 0;
      do {
        fVar21 = (float)(int)uVar9 / (float)gridSize;
        fVar22 = fVar21 + fVar21 + -1.0;
        iVar10 = iVar8 * uVar1 + (int)uVar9;
        pVVar2 = (this->m_positions).
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar2[iVar10].m_data[0] = fVar22;
        pVVar2[iVar10].m_data[1] = fVar20;
        pVVar2[iVar10].m_data[2] = 0.0;
        pVVar2[iVar10].m_data[3] = 1.0;
        (this->m_attribOne).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[iVar10] = 1.0;
        pVVar2 = (this->m_screenPos).
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + iVar10;
        pVVar2->m_data[0] = fVar21 * (float)width;
        pVVar2->m_data[1] = fVar19 * (float)height;
        pVVar2->m_data[2] = 0.0;
        pVVar2->m_data[3] = 0.0;
        pVVar2 = (this->m_coords).
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar2[iVar10].m_data[0] = fVar22;
        pVVar2[iVar10].m_data[1] = fVar20;
        *(ulong *)(pVVar2[iVar10].m_data + 2) =
             CONCAT44(fVar22 * -0.275 + -fVar20,fVar20 * 0.33 + -fVar22);
        pVVar2 = (this->m_unitCoords).
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar2[iVar10].m_data[0] = fVar21;
        pVVar2[iVar10].m_data[1] = fVar19;
        *(ulong *)(pVVar2[iVar10].m_data + 2) =
             CONCAT44(fVar21 * 0.5 + fVar19 * 0.25,fVar21 * 0.33 + fVar19 * 0.5);
        pMVar12 = (this->m_userAttribTransforms).
                  super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (0 < (int)((ulong)((long)(this->m_userAttribTransforms).
                                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar12) >> 6
                     )) {
          lVar6 = 0;
          lVar15 = 0;
          do {
            local_58[0] = fVar21;
            local_58[1] = fVar19;
            local_58[2] = 0.0;
            local_58[3] = 1.0;
            local_48 = 0;
            uStack_40 = 0;
            lVar13 = (long)(pMVar12->m_data).m_data[0].m_data + lVar6;
            lVar16 = 0;
            do {
              fVar22 = 0.0;
              lVar17 = 0;
              do {
                fVar22 = fVar22 + *(float *)(lVar13 + lVar17 * 4) *
                                  *(float *)((long)local_58 + lVar17);
                lVar17 = lVar17 + 4;
              } while (lVar17 != 0x10);
              *(float *)((long)&local_48 + lVar16 * 4) = fVar22;
              lVar16 = lVar16 + 1;
              lVar13 = lVar13 + 4;
            } while (lVar16 != 4);
            pVVar2 = this->m_userAttribs[lVar15].
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar10;
            *(undefined8 *)pVVar2->m_data = local_48;
            *(undefined8 *)((long)pVVar2->m_data + 8) = uStack_40;
            lVar15 = lVar15 + 1;
            pMVar12 = (this->m_userAttribTransforms).
                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar6 = lVar6 + 0x40;
          } while (lVar15 < (int)((ulong)((long)(this->m_userAttribTransforms).
                                                super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pMVar12) >> 6));
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar1);
      bVar18 = iVar8 != gridSize;
      iVar8 = iVar8 + 1;
    } while (bVar18);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&this->m_indices,(long)(this->m_numTriangles * 3));
  if (0 < gridSize) {
    puVar3 = (this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar8 = 0;
    iVar10 = 0;
    iVar11 = 0;
    do {
      iVar11 = iVar11 + 1;
      lVar6 = 0;
      iVar14 = iVar8;
      do {
        iVar4 = (int)lVar6;
        uVar5 = (unsigned_short)iVar14;
        uVar7 = (short)gridSize + uVar5 + 1;
        puVar3[iVar10 + iVar4] = uVar7;
        puVar3[iVar10 + 1 + iVar4] = uVar5;
        iVar14 = iVar14 + 1;
        puVar3[iVar10 + 2 + iVar4] = (unsigned_short)iVar14;
        puVar3[iVar10 + 3 + iVar4] = uVar7;
        puVar3[iVar10 + 4 + iVar4] = (unsigned_short)iVar14;
        puVar3[iVar10 + iVar4 + 5] = (short)gridSize + 2 + uVar5;
        lVar6 = lVar6 + 6;
      } while ((ulong)(uint)gridSize * 6 != lVar6);
      iVar10 = iVar10 + gridSize * 6;
      iVar8 = iVar8 + uVar1;
    } while (iVar11 != gridSize);
  }
  return;
}

Assistant:

QuadGrid::QuadGrid(int gridSize, int width, int height, const Vec4& constCoords,
				   const vector<Mat4>& userAttribTransforms, const vector<TextureBinding>& textures)
	: m_gridSize(gridSize)
	, m_numVertices((gridSize + 1) * (gridSize + 1))
	, m_numTriangles(gridSize * gridSize * 2)
	, m_constCoords(constCoords)
	, m_userAttribTransforms(userAttribTransforms)
	, m_textures(textures)
{
	Vec4 viewportScale = Vec4((float)width, (float)height, 0.0f, 0.0f);

	// Compute vertices.
	m_positions.resize(m_numVertices);
	m_coords.resize(m_numVertices);
	m_unitCoords.resize(m_numVertices);
	m_attribOne.resize(m_numVertices);
	m_screenPos.resize(m_numVertices);

	// User attributes.
	for (int i = 0; i < DE_LENGTH_OF_ARRAY(m_userAttribs); i++)
		m_userAttribs[i].resize(m_numVertices);

	for (int y = 0; y < gridSize + 1; y++)
		for (int x = 0; x < gridSize + 1; x++)
		{
			float sx	 = static_cast<float>(x) / static_cast<float>(gridSize);
			float sy	 = static_cast<float>(y) / static_cast<float>(gridSize);
			float fx	 = 2.0f * sx - 1.0f;
			float fy	 = 2.0f * sy - 1.0f;
			int   vtxNdx = ((y * (gridSize + 1)) + x);

			m_positions[vtxNdx]  = Vec4(fx, fy, 0.0f, 1.0f);
			m_attribOne[vtxNdx]  = 1.0f;
			m_screenPos[vtxNdx]  = Vec4(sx, sy, 0.0f, 1.0f) * viewportScale;
			m_coords[vtxNdx]	 = getCoords(sx, sy);
			m_unitCoords[vtxNdx] = getUnitCoords(sx, sy);

			for (int attribNdx					 = 0; attribNdx < getNumUserAttribs(); attribNdx++)
				m_userAttribs[attribNdx][vtxNdx] = getUserAttrib(attribNdx, sx, sy);
		}

	// Compute indices.
	m_indices.resize(3 * m_numTriangles);
	for (int y = 0; y < gridSize; y++)
		for (int x = 0; x < gridSize; x++)
		{
			int stride = gridSize + 1;
			int v00	= (y * stride) + x;
			int v01	= (y * stride) + x + 1;
			int v10	= ((y + 1) * stride) + x;
			int v11	= ((y + 1) * stride) + x + 1;

			int baseNdx			   = ((y * gridSize) + x) * 6;
			m_indices[baseNdx + 0] = static_cast<deUint16>(v10);
			m_indices[baseNdx + 1] = static_cast<deUint16>(v00);
			m_indices[baseNdx + 2] = static_cast<deUint16>(v01);

			m_indices[baseNdx + 3] = static_cast<deUint16>(v10);
			m_indices[baseNdx + 4] = static_cast<deUint16>(v01);
			m_indices[baseNdx + 5] = static_cast<deUint16>(v11);
		}
}